

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateCompositeExtract
          (InterfaceVariableScalarReplacement *this,uint32_t type_id,uint32_t composite_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indexes,uint32_t *extra_first_index)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<spvtools::opt::Operand> __l;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> this_00;
  uint32_t res_id;
  uint32_t *this_01;
  uint32_t ty_id;
  bool bVar1;
  __uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
  this_02;
  IRContext *c;
  reference puVar2;
  Operand *local_1d8;
  uint local_1cc;
  iterator local_1c8;
  undefined8 local_1c0;
  SmallVector<unsigned_int,_2UL> local_1b8;
  Operand local_190;
  uint local_15c;
  const_iterator cStack_158;
  uint32_t index;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  iterator local_138;
  undefined8 local_130;
  SmallVector<unsigned_int,_2UL> local_128;
  Operand local_100;
  allocator<spvtools::opt::Operand> local_cd;
  uint32_t local_cc;
  iterator local_c8;
  undefined8 local_c0;
  SmallVector<unsigned_int,_2UL> local_b8;
  Operand local_90;
  iterator local_60;
  _func_int **local_58;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_50;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  Instruction *composite_extract;
  uint32_t *puStack_28;
  uint32_t component_id;
  uint32_t *extra_first_index_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indexes_local;
  uint32_t composite_id_local;
  uint32_t type_id_local;
  InterfaceVariableScalarReplacement *this_local;
  
  puStack_28 = extra_first_index;
  extra_first_index_local = (uint32_t *)indexes;
  indexes_local._0_4_ = composite_id;
  indexes_local._4_4_ = type_id;
  _composite_id_local = this;
  composite_extract._4_4_ = Pass::TakeNextId(&this->super_Pass);
  this_02.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )operator_new(0x70);
  c = Pass::context(&this->super_Pass);
  ty_id = indexes_local._4_4_;
  res_id = composite_extract._4_4_;
  local_cc = (uint32_t)indexes_local;
  local_c8 = &local_cc;
  local_c0 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_c8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,init_list_01);
  Operand::Operand(&local_90,SPV_OPERAND_TYPE_ID,&local_b8);
  local_60 = &local_90;
  local_58 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator(&local_cd);
  __l._M_len = (size_type)local_58;
  __l._M_array = local_60;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_50,__l,&local_cd);
  Instruction::Instruction
            ((Instruction *)
             this_02.
             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             .
             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
             ._M_head_impl,c,OpCompositeExtract,ty_id,res_id,&local_50);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_50);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_cd);
  local_1d8 = (Operand *)&local_60;
  do {
    local_1d8 = local_1d8 + -1;
    Operand::~Operand(local_1d8);
  } while (local_1d8 != &local_90);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b8);
  local_38._M_head_impl =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
       this_02.
       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
       _M_head_impl;
  if (puStack_28 != (uint32_t *)0x0) {
    __range2._4_4_ = *puStack_28;
    local_138 = (iterator)((long)&__range2 + 4);
    local_130 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_138;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_128,init_list_00);
    Operand::Operand(&local_100,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_128);
    Instruction::AddOperand
              ((Instruction *)
               this_02.
               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl,&local_100);
    Operand::~Operand(&local_100);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_128);
  }
  this_01 = extra_first_index_local;
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)extra_first_index_local
                     );
  cStack_158 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffea8);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    this_00._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38;
    local_1cc = *puVar2;
    local_1c8 = &local_1cc;
    local_1c0 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_1c8;
    local_15c = local_1cc;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1b8,init_list);
    Operand::Operand(&local_190,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_1b8);
    Instruction::AddOperand((Instruction *)this_00._M_head_impl,&local_190);
    Operand::~Operand(&local_190);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1b8);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  return (Instruction *)local_38._M_head_impl;
}

Assistant:

Instruction* InterfaceVariableScalarReplacement::CreateCompositeExtract(
    uint32_t type_id, uint32_t composite_id,
    const std::vector<uint32_t>& indexes, const uint32_t* extra_first_index) {
  uint32_t component_id = TakeNextId();
  Instruction* composite_extract = new Instruction(
      context(), spv::Op::OpCompositeExtract, type_id, component_id,
      std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {composite_id}}});
  if (extra_first_index) {
    composite_extract->AddOperand(
        {SPV_OPERAND_TYPE_LITERAL_INTEGER, {*extra_first_index}});
  }
  for (uint32_t index : indexes) {
    composite_extract->AddOperand({SPV_OPERAND_TYPE_LITERAL_INTEGER, {index}});
  }
  return composite_extract;
}